

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void wallet::FlushAndDeleteWallet(CWallet *wallet)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock12;
  string name;
  CWallet *in_stack_ffffffffffffff78;
  key_type *in_stack_ffffffffffffff80;
  CWallet *in_stack_ffffffffffffff88;
  char *pszFile;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffac;
  GlobalMutex *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  char *this;
  CWallet *in_stack_ffffffffffffffc8;
  char local_28 [32];
  ConstevalFormatString<1U> wallet_fmt;
  
  wallet_fmt.fmt = *(char **)(in_FS_OFFSET + 0x28);
  CWallet::GetName_abi_cxx11_(in_stack_ffffffffffffff78);
  pszFile = local_28;
  std::__cxx11::string::string(in_RDI,in_stack_ffffffffffffffb8);
  this = "Releasing wallet %s..\n";
  CWallet::WalletLogPrintf<std::__cxx11::string>(in_stack_ffffffffffffffc8,wallet_fmt,in_RDI);
  CWallet::Flush(in_stack_ffffffffffffff78);
  if (in_RDI != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    CWallet::~CWallet(in_stack_ffffffffffffff88);
    operator_delete(in_RDI,0x4a8);
  }
  MaybeCheckNotHeld<GlobalMutex>((GlobalMutex *)in_stack_ffffffffffffff78);
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)this,in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),pszFile,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  uVar2 = (uint)(sVar1 == 0);
  UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffff78);
  if (uVar2 == 0) {
    std::condition_variable::notify_all();
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff78);
  if (*(char **)(in_FS_OFFSET + 0x28) == wallet_fmt.fmt) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void FlushAndDeleteWallet(CWallet* wallet)
{
    const std::string name = wallet->GetName();
    wallet->WalletLogPrintf("Releasing wallet %s..\n", name);
    wallet->Flush();
    delete wallet;
    // Wallet is now released, notify WaitForDeleteWallet, if any.
    {
        LOCK(g_wallet_release_mutex);
        if (g_unloading_wallet_set.erase(name) == 0) {
            // WaitForDeleteWallet was not called for this wallet, all done.
            return;
        }
    }
    g_wallet_release_cv.notify_all();
}